

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_parser.cpp
# Opt level: O2

string * __thiscall libtorrent::http_parser::header_abi_cxx11_(http_parser *this,string_view key)

{
  int iVar1;
  const_iterator cVar2;
  _Base_ptr p_Var3;
  allocator<char> local_49;
  char *local_48;
  size_t local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  local_40 = key.len_;
  local_48 = key.ptr_;
  if (header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_ ==
      '\0') {
    iVar1 = __cxa_guard_acquire(&header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)
                                 ::empty_abi_cxx11_);
    if (iVar1 != 0) {
      header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_.
      _M_dataplus._M_p =
           (pointer)&header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::
                     empty_abi_cxx11_.field_2;
      header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_.
      _M_string_length = 0;
      header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::empty_abi_cxx11_.
      field_2._M_local_buf[0] = '\0';
      __cxa_atexit(std::__cxx11::string::~string,
                   &header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::
                    empty_abi_cxx11_,&__dso_handle);
      __cxa_guard_release(&header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)
                           ::empty_abi_cxx11_);
    }
  }
  boost::basic_string_view<char,std::char_traits<char>>::to_string<std::allocator<char>>
            (&local_38,(basic_string_view<char,std::char_traits<char>> *)&local_48,&local_49);
  cVar2 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->m_header)._M_t,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  p_Var3 = (_Base_ptr)
           &header[abi:cxx11](boost::basic_string_view<char,std::char_traits<char>>)::
            empty_abi_cxx11_;
  if ((_Rb_tree_header *)cVar2._M_node != &(this->m_header)._M_t._M_impl.super__Rb_tree_header) {
    p_Var3 = cVar2._M_node + 2;
  }
  return (string *)p_Var3;
}

Assistant:

std::string const& http_parser::header(string_view const key) const
	{
		static std::string const empty;
		// TODO: remove to_string() if we're in C++14
		auto const i = m_header.find(key.to_string());
		if (i == m_header.end()) return empty;
		return i->second;
	}